

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

UtxoData * __thiscall
cfd::ConfidentialTransactionContext::GetTxInUtxoData
          (ConfidentialTransactionContext *this,OutPoint *outpoint)

{
  UtxoData *in_RDI;
  UtxoData *in_stack_00000020;
  UtxoData *in_stack_00000028;
  UtxoData *utxo;
  
  UtxoData::UtxoData(in_stack_00000020);
  in_RDI->address_type = kP2shAddress;
  in_RDI->vout = 0;
  in_RDI->block_height = 0;
  in_RDI->binary_data = (void *)0x0;
  IsFindUtxoMap(this,outpoint,in_stack_00000028);
  return in_RDI;
}

Assistant:

UtxoData ConfidentialTransactionContext::GetTxInUtxoData(
    const OutPoint& outpoint) const {
  UtxoData utxo;
  utxo.address_type = AddressType::kP2shAddress;
  utxo.vout = 0;
  utxo.block_height = 0;
  utxo.binary_data = nullptr;
  IsFindUtxoMap(outpoint, &utxo);
  return utxo;
}